

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.c
# Opt level: O3

int quicly_decode_ack_frame(uint8_t **src,uint8_t *end,quicly_ack_frame_t *frame,int is_ack_ecn)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint64_t uVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  ulong uVar10;
  
  pbVar7 = *src;
  if (pbVar7 == end) goto LAB_00120eaa;
  if (*pbVar7 < 0x40) {
    pbVar9 = pbVar7 + 1;
    *src = pbVar9;
    uVar4 = (ulong)*pbVar7;
    frame->largest_acknowledged = uVar4;
  }
  else {
    uVar10 = 1L << (*pbVar7 >> 6);
    if ((ulong)((long)end - (long)pbVar7) < uVar10 || (long)end - (long)pbVar7 < 0)
    goto LAB_00120eaa;
    *src = pbVar7 + 1;
    uVar4 = (ulong)(*pbVar7 & 0x3f);
    lVar5 = uVar10 - 1;
    pbVar7 = pbVar7 + 1;
    do {
      pbVar9 = pbVar7 + 1;
      *src = pbVar9;
      uVar4 = (ulong)*pbVar7 | uVar4 << 8;
      lVar5 = lVar5 + -1;
      pbVar7 = pbVar9;
    } while (lVar5 != 0);
    frame->largest_acknowledged = uVar4;
    if (uVar4 == 0xffffffffffffffff) {
      return 7;
    }
  }
  if (pbVar9 == end) {
LAB_00120e28:
    frame = (quicly_ack_frame_t *)&frame->ack_delay;
  }
  else {
    if (*pbVar9 < 0x40) {
      pbVar8 = pbVar9 + 1;
      *src = pbVar8;
      frame->ack_delay = (ulong)*pbVar9;
    }
    else {
      uVar10 = 1L << (*pbVar9 >> 6);
      if ((ulong)((long)end - (long)pbVar9) < uVar10 || (long)end - (long)pbVar9 < 0)
      goto LAB_00120e28;
      *src = pbVar9 + 1;
      uVar3 = (ulong)(*pbVar9 & 0x3f);
      lVar5 = uVar10 - 1;
      pbVar7 = pbVar9 + 1;
      do {
        pbVar8 = pbVar7 + 1;
        *src = pbVar8;
        uVar3 = (ulong)*pbVar7 | uVar3 << 8;
        lVar5 = lVar5 + -1;
        pbVar7 = pbVar8;
      } while (lVar5 != 0);
      frame->ack_delay = uVar3;
      if (uVar3 == 0xffffffffffffffff) {
        return 7;
      }
    }
    if (pbVar8 != end) {
      if (*pbVar8 < 0x40) {
        pbVar9 = pbVar8 + 1;
        *src = pbVar9;
        uVar3 = (ulong)*pbVar8;
        frame->num_gaps = uVar3;
LAB_00120ef2:
        if (pbVar9 == end) {
          return 7;
        }
        if (*pbVar9 < 0x40) {
          pbVar8 = pbVar9 + 1;
          *src = pbVar8;
          uVar2 = (ulong)*pbVar9;
        }
        else {
          uVar10 = 1L << (*pbVar9 >> 6);
          if ((ulong)((long)end - (long)pbVar9) < uVar10 || (long)end - (long)pbVar9 < 0) {
            return 7;
          }
          *src = pbVar9 + 1;
          uVar2 = (ulong)(*pbVar9 & 0x3f);
          lVar5 = uVar10 - 1;
          pbVar7 = pbVar9 + 1;
          do {
            pbVar8 = pbVar7 + 1;
            *src = pbVar8;
            uVar2 = (ulong)*pbVar7 | uVar2 << 8;
            lVar5 = lVar5 + -1;
            pbVar7 = pbVar8;
          } while (lVar5 != 0);
          if (uVar2 == 0xffffffffffffffff) {
            return 7;
          }
        }
        if (uVar4 < uVar2) {
          return 7;
        }
        frame->smallest_acknowledged = uVar4 - uVar2;
        frame->ack_block_lengths[0] = uVar2 + 1;
        if (uVar3 != 0) {
          uVar6 = 0;
          do {
            if (pbVar8 == end) {
              return 7;
            }
            if (*pbVar8 < 0x40) {
              pbVar9 = pbVar8 + 1;
              *src = pbVar9;
              uVar4 = (ulong)*pbVar8;
            }
            else {
              uVar10 = 1L << (*pbVar8 >> 6);
              if ((long)end - (long)pbVar8 < 0) {
                return 7;
              }
              if ((ulong)((long)end - (long)pbVar8) < uVar10) {
                return 7;
              }
              *src = pbVar8 + 1;
              uVar4 = (ulong)(*pbVar8 & 0x3f);
              lVar5 = uVar10 - 1;
              pbVar7 = pbVar8 + 1;
              do {
                pbVar9 = pbVar7 + 1;
                *src = pbVar9;
                uVar4 = (ulong)*pbVar7 | uVar4 << 8;
                lVar5 = lVar5 + -1;
                pbVar7 = pbVar9;
              } while (lVar5 != 0);
              if (uVar4 == 0xffffffffffffffff) {
                return 7;
              }
            }
            frame->gaps[uVar6] = uVar4 + 1;
            if (frame->smallest_acknowledged <= uVar4) {
              return 7;
            }
            uVar10 = frame->smallest_acknowledged - (uVar4 + 1);
            frame->smallest_acknowledged = uVar10;
            if (pbVar9 == end) {
              return 7;
            }
            if (*pbVar9 < 0x40) {
              pbVar8 = pbVar9 + 1;
              *src = pbVar8;
              uVar3 = (ulong)*pbVar9;
            }
            else {
              uVar4 = 1L << (*pbVar9 >> 6);
              if ((long)end - (long)pbVar9 < 0) {
                return 7;
              }
              if ((ulong)((long)end - (long)pbVar9) < uVar4) {
                return 7;
              }
              *src = pbVar9 + 1;
              uVar3 = (ulong)(*pbVar9 & 0x3f);
              lVar5 = uVar4 - 1;
              pbVar7 = pbVar9 + 1;
              do {
                pbVar8 = pbVar7 + 1;
                *src = pbVar8;
                uVar3 = (ulong)*pbVar7 | uVar3 << 8;
                lVar5 = lVar5 + -1;
                pbVar7 = pbVar8;
              } while (lVar5 != 0);
              if (uVar3 == 0xffffffffffffffff) {
                return 7;
              }
            }
            if (uVar10 <= uVar3) {
              return 7;
            }
            frame->ack_block_lengths[uVar6 + 1] = uVar3 + 1;
            frame->smallest_acknowledged = frame->smallest_acknowledged - (uVar3 + 1);
            uVar6 = uVar6 + 1;
          } while (uVar6 != frame->num_gaps);
        }
        if (is_ack_ecn == 0) {
          return 0;
        }
        lVar5 = 0;
        do {
          if (pbVar8 == end) {
            return 7;
          }
          if (*pbVar8 < 0x40) {
            pbVar8 = pbVar8 + 1;
            *src = pbVar8;
          }
          else {
            uVar10 = 1L << (*pbVar8 >> 6);
            if ((long)end - (long)pbVar8 < 0) {
              return 7;
            }
            if ((ulong)((long)end - (long)pbVar8) < uVar10) {
              return 7;
            }
            *src = pbVar8 + 1;
            uVar4 = (ulong)(*pbVar8 & 0x3f);
            lVar1 = uVar10 - 1;
            pbVar7 = pbVar8 + 1;
            do {
              pbVar8 = pbVar7 + 1;
              *src = pbVar8;
              uVar4 = (ulong)*pbVar7 | uVar4 << 8;
              lVar1 = lVar1 + -1;
              pbVar7 = pbVar8;
            } while (lVar1 != 0);
            if (uVar4 == 0xffffffffffffffff) {
              return 7;
            }
          }
          lVar5 = lVar5 + 1;
          if (lVar5 == 3) {
            return 0;
          }
        } while( true );
      }
      uVar10 = 1L << (*pbVar8 >> 6);
      if (uVar10 <= (ulong)((long)end - (long)pbVar8) && -1 < (long)end - (long)pbVar8) {
        *src = pbVar8 + 1;
        uVar3 = (ulong)(*pbVar8 & 0x3f);
        lVar5 = uVar10 - 1;
        pbVar7 = pbVar8 + 1;
        do {
          pbVar9 = pbVar7 + 1;
          *src = pbVar9;
          uVar3 = (ulong)*pbVar7 | uVar3 << 8;
          lVar5 = lVar5 + -1;
          pbVar7 = pbVar9;
        } while (lVar5 != 0);
        frame->num_gaps = uVar3;
        if (uVar3 == 0xffffffffffffffff) {
          return 7;
        }
        goto LAB_00120ef2;
      }
    }
    frame = (quicly_ack_frame_t *)&frame->num_gaps;
  }
LAB_00120eaa:
  frame->largest_acknowledged = 0xffffffffffffffff;
  return 7;
}

Assistant:

int quicly_decode_ack_frame(const uint8_t **src, const uint8_t *end, quicly_ack_frame_t *frame, int is_ack_ecn)
{
    uint64_t i, tmp;

    if ((frame->largest_acknowledged = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    if ((frame->ack_delay = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    if ((frame->num_gaps = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;

    if ((tmp = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    if (frame->largest_acknowledged < tmp)
        goto Error;
    frame->smallest_acknowledged = frame->largest_acknowledged - tmp;
    frame->ack_block_lengths[0] = tmp + 1;

    for (i = 0; i != frame->num_gaps; ++i) {
        if ((tmp = quicly_decodev(src, end)) == UINT64_MAX)
            goto Error;
        frame->gaps[i] = tmp + 1;
        if (frame->smallest_acknowledged < frame->gaps[i])
            goto Error;
        frame->smallest_acknowledged -= frame->gaps[i];
        if ((tmp = quicly_decodev(src, end)) == UINT64_MAX)
            goto Error;
        tmp += 1;
        if (frame->smallest_acknowledged < tmp)
            goto Error;
        frame->ack_block_lengths[i + 1] = tmp;
        frame->smallest_acknowledged -= tmp;
    }

    if (is_ack_ecn) {
        /* just skip ECT(0), ECT(1), ECT-CE counters for the time being */
        for (i = 0; i != 3; ++i)
            if (quicly_decodev(src, end) == UINT64_MAX)
                goto Error;
    }
    return 0;
Error:
    return QUICLY_ERROR_FRAME_ENCODING;
}